

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

ON_NurbsCurve * ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA(ON_BinaryArchive *file)

{
  bool bVar1;
  ON_NurbsCurve *this;
  double *p;
  uint i;
  int cv_count;
  int order;
  int is_rat;
  int dim;
  int version;
  ON__UINT32 tcode;
  int flag;
  ON__INT64 big_value;
  
  tcode = 0;
  big_value = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&tcode,&big_value);
  if (bVar1) {
    if (((((tcode == 0x2fffe) && (bVar1 = ON_BinaryArchive::ReadInt(file,&version), bVar1)) &&
         (version = version & 0xfffffeff, 0xfffffffd < version - 0x66U)) &&
        ((ON_BinaryArchive::ReadInt(file,&dim), 0 < dim &&
         (ON_BinaryArchive::ReadInt(file,&is_rat), (uint)is_rat < 2)))) &&
       ((ON_BinaryArchive::ReadInt(file,&order), 1 < order &&
        ((ON_BinaryArchive::ReadInt(file,&cv_count), order <= cv_count &&
         (ON_BinaryArchive::ReadInt(file,&flag), flag == 0)))))) {
      this = (ON_NurbsCurve *)operator_new(0x40);
      ON_NurbsCurve::ON_NurbsCurve(this,dim,is_rat != 0,order,cv_count);
      bVar1 = ON_BinaryArchive::ReadDouble(file,(long)(order + cv_count + -2),this->m_knot);
      i = 0;
      if (bVar1) {
        for (; (int)i < cv_count; i = i + 1) {
          p = ON_NurbsCurve::CV(this,i);
          bVar1 = ON_BinaryArchive::ReadDouble(file,((long)dim + 1) - (ulong)(is_rat == 0),p);
          if (!bVar1) break;
        }
        i = (uint)(cv_count <= (int)i);
      }
    }
    else {
      i = 0;
      this = (ON_NurbsCurve *)0x0;
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
    if (this == (ON_NurbsCurve *)0x0) {
      return (ON_NurbsCurve *)0x0;
    }
    if ((bVar1 & (byte)i) != 0) {
      return this;
    }
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this);
  }
  return (ON_NurbsCurve *)0x0;
}

Assistant:

static
ON_NurbsCurve* ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA( ON_BinaryArchive& file )
{
  // read TCODE_RHINOIO_OBJECT_DATA chunk that is contained in a
  // TCODE_RHINOIO_OBJECT_NURBS_CURVE chunk.  The TCODE_RHINOIO_OBJECT_DATA
  // chunk contains the definition of NURBS curves written by the 
  // old RhinoIO toolkit.
  ON_NurbsCurve* curve = 0;
  bool rc = false;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  int version, dim, is_rat, order, cv_count, flag, i;
  if ( !file.BeginRead3dmBigChunk( &tcode, &big_value ) )
    return nullptr;
  if ( tcode == TCODE_RHINOIO_OBJECT_DATA ) for (;;) {
    if ( !file.ReadInt(&version) )
      break;
    // int bReverse = version & 0x100;
    version &= 0xFFFFFEFF;
    if ( version != 100 && version != 101 )
      break;
    file.ReadInt(&dim);
    if ( dim < 1 )
      break;
    file.ReadInt(&is_rat);
    if ( is_rat < 0 || is_rat > 1 )
      break;
    file.ReadInt(&order);
    if ( order < 2 )
      break;
    file.ReadInt(&cv_count);
    if ( cv_count < order )
      break;
    file.ReadInt(&flag);
    if ( flag != 0 )
      break;

    curve = new ON_NurbsCurve(dim,is_rat,order,cv_count);
    if ( !file.ReadDouble( order+cv_count-2, curve->m_knot ) )
      break;
    int cvdim = is_rat ? dim+1 : dim;
    for ( i = 0; i < cv_count; i++ ) {
      if ( !file.ReadDouble( cvdim, curve->CV(i) ) )
        break;
    }
    if ( i < cv_count )
      break;
    rc = true;
    break;
  }
  if ( !file.EndRead3dmChunk() ) // end of TCODE_RHINOIO_OBJECT_DATA chunk
    rc = false;
  if ( !rc && curve ) {
    delete curve;
    curve = 0;
  }

  return curve;
}